

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u32.c
# Opt level: O1

u32 u32Shuffle(u32 w)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (w >> 8 ^ w) & 0xff00;
  uVar2 = (uVar1 << 8 | uVar1) ^ w;
  uVar1 = (uVar2 >> 4 ^ uVar2) & 0xf000f0;
  uVar2 = (uVar1 << 4 | uVar1) ^ uVar2;
  uVar2 = ((uVar2 >> 2 ^ uVar2) & 0xc0c0c0c) * 5 ^ uVar2;
  return ((uVar2 >> 1 ^ uVar2) & 0x22222222) * 3 ^ uVar2;
}

Assistant:

u32 u32Shuffle(register u32 w)
{
	register u32 t;
	t = (w ^ (w >> 8)) & 0x0000FF00, w ^= t ^ (t << 8);
	t = (w ^ (w >> 4)) & 0x00F000F0, w ^= t ^ (t << 4);
	t = (w ^ (w >> 2)) & 0x0C0C0C0C, w ^= t ^ (t << 2);
	t = (w ^ (w >> 1)) & 0x22222222, w ^= t ^ (t << 1);
	t = 0;
	return w;
}